

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsa.cc
# Opt level: O1

int DSA_set0_pqg(DSA *dsa,BIGNUM *p,BIGNUM *q,BIGNUM *g)

{
  int iVar1;
  
  iVar1 = 0;
  if (((p != (BIGNUM *)0x0 || (BIGNUM *)dsa->p != (BIGNUM *)0x0) &&
      (iVar1 = 0, dsa->q != (BIGNUM *)0x0 || q != (BIGNUM *)0x0)) &&
     (iVar1 = 0, dsa->g != (BIGNUM *)0x0 || g != (BIGNUM *)0x0)) {
    if (p != (BIGNUM *)0x0) {
      BN_free((BIGNUM *)dsa->p);
      dsa->p = p;
    }
    if (q != (BIGNUM *)0x0) {
      BN_free((BIGNUM *)dsa->q);
      dsa->q = q;
    }
    if (g != (BIGNUM *)0x0) {
      BN_free((BIGNUM *)dsa->g);
      dsa->g = g;
    }
    BN_MONT_CTX_free((BN_MONT_CTX *)dsa->method_mont_p);
    dsa->method_mont_p = (BN_MONT_CTX *)0x0;
    BN_MONT_CTX_free((BN_MONT_CTX *)dsa->method_mont_q);
    dsa->method_mont_q = (BN_MONT_CTX *)0x0;
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

int DSA_set0_pqg(DSA *dsa, BIGNUM *p, BIGNUM *q, BIGNUM *g) {
  if ((dsa->p == NULL && p == NULL) || (dsa->q == NULL && q == NULL) ||
      (dsa->g == NULL && g == NULL)) {
    return 0;
  }

  if (p != NULL) {
    BN_free(dsa->p);
    dsa->p = p;
  }
  if (q != NULL) {
    BN_free(dsa->q);
    dsa->q = q;
  }
  if (g != NULL) {
    BN_free(dsa->g);
    dsa->g = g;
  }

  BN_MONT_CTX_free(dsa->method_mont_p);
  dsa->method_mont_p = NULL;
  BN_MONT_CTX_free(dsa->method_mont_q);
  dsa->method_mont_q = NULL;
  return 1;
}